

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [24])

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  size_t sVar1;
  undefined1 *puVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  local_28._M_head_impl = in_RAX;
  Message::Message((Message *)&local_28);
  puVar2 = &(local_28._M_head_impl)->field_0x10;
  sVar1 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,*value,sVar1);
  AppendMessage(this,(Message *)&local_28);
  if (local_28._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }